

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

boolean snuff_lit(obj *obj)

{
  boolean bVar1;
  undefined8 in_RAX;
  char *pcVar2;
  char *pcVar3;
  xchar y;
  xchar x;
  undefined2 local_12;
  
  local_12 = (undefined2)((ulong)in_RAX >> 0x30);
  if ((obj->field_0x4c & 8) == 0) {
    return '\0';
  }
  if ((2 < (ushort)obj->otyp - 0xe7) && (obj->otyp != 0x142)) {
    bVar1 = snuff_candle(obj);
    if (bVar1 == '\0') {
      return '\0';
    }
    return '\x01';
  }
  get_obj_location(obj,(xchar *)((long)&local_12 + 1),(xchar *)&local_12,0);
  if (obj->where == '\x04') {
    if ((viz_array[(char)local_12][local_12._1_1_] & 2U) == 0) goto LAB_001411ad;
  }
  else {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
        if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_0014117f;
        goto LAB_0014113f;
      }
    }
    else {
LAB_0014113f:
      if (ublindf == (obj *)0x0) goto LAB_001411ad;
    }
    if (ublindf->oartifact != '\x1d') goto LAB_001411ad;
  }
LAB_0014117f:
  pcVar2 = Yname2(obj);
  pcVar3 = otense(obj,"go");
  pline("%s %s out!",pcVar2,pcVar3);
LAB_001411ad:
  end_burn(obj,'\x01');
  return '\x01';
}

Assistant:

boolean snuff_lit(struct obj *obj)
{
	xchar x, y;

	if (obj->lamplit) {
	    if (obj->otyp == OIL_LAMP || obj->otyp == MAGIC_LAMP ||
		    obj->otyp == BRASS_LANTERN || obj->otyp == POT_OIL) {
		get_obj_location(obj, &x, &y, 0);
		if (obj->where == OBJ_MINVENT ? cansee(x,y) : !Blind)
		    pline("%s %s out!", Yname2(obj), otense(obj, "go"));
		end_burn(obj, TRUE);
		return TRUE;
	    }
	    if (snuff_candle(obj)) return TRUE;
	}
	return FALSE;
}